

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateGLImpl.cpp
# Opt level: O2

void __thiscall
Diligent::PipelineStateGLImpl::InitResourceLayout
          (PipelineStateGLImpl *this,PSO_CREATE_INTERNAL_FLAGS InternalFlags,
          TShaderStages *ShaderStages,SHADER_TYPE ActiveStages)

{
  pointer ppSVar1;
  long lVar2;
  GLProgram *pGVar3;
  SignatureAutoPtrType *pSVar4;
  TBindings TVar5;
  PIPELINE_RESOURCE_FLAGS PVar6;
  LinkStatus LVar7;
  __shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2> *p_Var8;
  RenderDeviceGLImpl *pRVar9;
  undefined4 in_register_0000000c;
  char (*Args_1) [99];
  GLContextState *State;
  Uint32 s;
  ulong uVar10;
  Uint32 p;
  ulong uVar11;
  long lVar12;
  bool bIsDeviceInternal;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_180;
  string msg;
  shared_ptr<const_Diligent::ShaderResourcesGL> local_158;
  TShaderStages *local_148;
  GLContextState *local_140;
  __shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2> local_138;
  TBindings Bindings;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_120 [20];
  PipelineResourceSignatureDesc local_80;
  shared_ptr<const_Diligent::ShaderResourcesGL> local_40;
  
  Args_1 = (char (*) [99])CONCAT44(in_register_0000000c,ActiveStages);
  if ((this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).m_UsingImplicitSignature == true
     ) {
    if ((InternalFlags & PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0) !=
        PSO_CREATE_INTERNAL_FLAG_NONE) {
      RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl>::Release
                ((this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).m_Signatures);
    }
    GetDefaultSignatureDesc
              ((PipelineResourceSignatureDescWrapper *)&Bindings,this,ShaderStages,ActiveStages);
    Args_1 = (char (*) [99])&bIsDeviceInternal;
    bIsDeviceInternal = true;
    msg._M_dataplus._M_p._0_4_ =
         (this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).m_ActiveShaderStages;
    PipelineStateBase<Diligent::EngineGLImplTraits>::
    InitDefaultSignature<Diligent::SHADER_TYPE,bool>
              (&this->super_PipelineStateBase<Diligent::EngineGLImplTraits>,&local_80,
               (SHADER_TYPE *)&msg,(bool *)Args_1);
    if (((this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).m_Signatures)->m_pObject ==
        (PipelineResourceSignatureGLImpl *)0x0) {
      FormatString<char[26],char[16]>
                (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"m_Signatures[0]",
                 (char (*) [16])Args_1);
      Args_1 = (char (*) [99])0xbf;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"InitResourceLayout",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
                 ,0xbf);
      std::__cxx11::string::~string((string *)&msg);
    }
    PipelineResourceSignatureDescWrapper::~PipelineResourceSignatureDescWrapper
              ((PipelineResourceSignatureDescWrapper *)&Bindings);
  }
  RenderDeviceBase<Diligent::EngineGLImplTraits>::GetImmediateContext
            ((RenderDeviceBase<Diligent::EngineGLImplTraits> *)&Bindings,
             (size_t)(this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).
                     super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                     .m_pDevice);
  TVar5 = Bindings;
  RefCntAutoPtr<Diligent::DeviceContextGLImpl>::Release
            ((RefCntAutoPtr<Diligent::DeviceContextGLImpl> *)&Bindings);
  if (TVar5._M_elems == (_Type)0x0) {
    FormatString<char[26],char[25]>
              ((string *)&Bindings,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"pImmediateCtx != nullptr",(char (*) [25])Args_1);
    Args_1 = (char (*) [99])0xc3;
    DebugAssertionFailed
              ((Char *)Bindings._M_elems,"InitResourceLayout",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
               ,0xc3);
    std::__cxx11::string::~string((string *)&Bindings);
  }
  State = (GLContextState *)((long)TVar5._M_elems + 0x750);
  local_140 = State;
  if (this->m_IsProgramPipelineSupported == true) {
    local_180 = &local_138._M_refcount;
    lVar12 = 0;
    local_148 = ShaderStages;
    for (uVar10 = 0;
        ppSVar1 = (local_148->
                  super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>
                  )._M_impl.super__Vector_impl_data._M_start,
        uVar10 < (ulong)((long)(local_148->
                               super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar1 >> 3);
        uVar10 = uVar10 + 1) {
      lVar2 = *(long *)((long)ppSVar1 + lVar12);
      std::__shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2> *)
                 &Bindings,
                 (__shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2> *)
                 (lVar2 + 0xa0));
      pGVar3 = *(GLProgram **)
                ((long)&(this->m_GLPrograms->
                        super___shared_ptr<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                + lVar12 * 2);
      std::__shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_138,
                 (__shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2> *)
                 &Bindings);
      GLProgram::SetResources(pGVar3,(shared_ptr<const_Diligent::ShaderResourcesGL> *)&local_138);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_138._M_refcount);
      local_158.super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)Bindings._M_elems;
      local_158.super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = a_Stack_120[0]._M_pi;
      Bindings._M_elems[0] = 0;
      Bindings._M_elems[1] = 0;
      Bindings._M_elems[2] = 0;
      Bindings._M_elems[3] = 0;
      a_Stack_120[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ValidateShaderResources
                (this,&local_158,*(char **)(lVar2 + 0x18),*(SHADER_TYPE *)(lVar2 + 0x20));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_158.
                  super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_120);
      lVar12 = lVar12 + 8;
    }
    goto LAB_0016fabe;
  }
  pGVar3 = (this->m_GLPrograms->super___shared_ptr<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2>)
           ._M_ptr;
  if (pGVar3 == (GLProgram *)0x0) {
LAB_0016f9c0:
    FormatString<char[26],char[99]>
              ((string *)&Bindings,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "m_GLPrograms[0] != nullptr && m_GLPrograms[0]->GetLinkStatus() == GLProgram::LinkStatus::Succeeded"
               ,Args_1);
    DebugAssertionFailed
              ((Char *)Bindings._M_elems,"InitResourceLayout",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
               ,0xd2);
    std::__cxx11::string::~string((string *)&Bindings);
  }
  else {
    LVar7 = GLProgram::GetLinkStatus(pGVar3,false);
    if (LVar7 != Succeeded) goto LAB_0016f9c0;
  }
  std::__shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2> *)
             &Bindings,
             &(((this->m_GLPrograms->
                super___shared_ptr<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              m_pResources).
              super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>);
  if (Bindings._M_elems == (_Type)0x0) {
    PVar6 = GetSamplerResourceFlag(this,ShaderStages,false);
    pGVar3 = (this->m_GLPrograms->
             super___shared_ptr<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    PVar6 = GetSamplerResourceFlag(this,ShaderStages,PVar6 != PIPELINE_RESOURCE_FLAG_NONE);
    p_Var8 = &GLProgram::LoadResources
                        (pGVar3,ActiveStages,PVar6,State,false,SHADER_SOURCE_LANGUAGE_DEFAULT)->
              super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2> *)
               &Bindings,p_Var8);
  }
  local_40.super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = a_Stack_120[0]._M_pi;
  Bindings._M_elems[0] = 0;
  Bindings._M_elems[1] = 0;
  Bindings._M_elems[2] = 0;
  Bindings._M_elems[3] = 0;
  a_Stack_120[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ValidateShaderResources
            (this,&local_40,
             (this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).
             super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
             .m_Desc.super_DeviceObjectAttribs.Name,ActiveStages);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40.
              super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_120);
LAB_0016fabe:
  Bindings._M_elems[0] = 0;
  Bindings._M_elems[1] = 0;
  Bindings._M_elems[2] = 0;
  Bindings._M_elems[3] = 0;
  for (uVar10 = 0;
      uVar10 < (this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).m_SignatureCount;
      uVar10 = uVar10 + 1) {
    pSVar4 = (this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).m_Signatures;
    if (pSVar4[uVar10].m_pObject != (PipelineResourceSignatureGLImpl *)0x0) {
      *&this->m_BaseBindings[uVar10]._M_elems = Bindings._M_elems;
      lVar12 = 0;
      for (uVar11 = 0; uVar11 < this->m_NumPrograms; uVar11 = uVar11 + 1) {
        GLProgram::ApplyBindings
                  (*(GLProgram **)
                    ((long)&(this->m_GLPrograms->
                            super___shared_ptr<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr + lVar12),pSVar4[uVar10].m_pObject,local_140,&Bindings);
        lVar12 = lVar12 + 0x10;
      }
      PipelineResourceSignatureGLImpl::ShiftBindings(pSVar4[uVar10].m_pObject,&Bindings);
    }
  }
  pRVar9 = DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
           ::GetDevice((DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                        *)this);
  if ((uint)(pRVar9->m_DeviceLimits).MaxUniformBlocks < (uint)Bindings._M_elems[0]) {
    msg._M_dataplus._M_p = GetBindingRangeName(BINDING_RANGE_UNIFORM_BUFFER);
    LogError<true,char[34],char_const*,char[40],int,char[3]>
              (false,"InitResourceLayout",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
               ,0xf8,(char (*) [34])"The number of bindings in range \'",(char **)&msg,
               (char (*) [40])"\' is greater than the maximum allowed (",
               &(pRVar9->m_DeviceLimits).MaxUniformBlocks,(char (*) [3])0x2ed6c5);
  }
  if ((uint)(pRVar9->m_DeviceLimits).MaxTextureUnits < (uint)Bindings._M_elems[1]) {
    msg._M_dataplus._M_p = GetBindingRangeName(BINDING_RANGE_TEXTURE);
    LogError<true,char[34],char_const*,char[40],int,char[3]>
              (false,"InitResourceLayout",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
               ,0xfa,(char (*) [34])"The number of bindings in range \'",(char **)&msg,
               (char (*) [40])"\' is greater than the maximum allowed (",
               &(pRVar9->m_DeviceLimits).MaxTextureUnits,(char (*) [3])0x2ed6c5);
  }
  if ((uint)(pRVar9->m_DeviceLimits).MaxStorageBlock < (uint)Bindings._M_elems[3]) {
    msg._M_dataplus._M_p = GetBindingRangeName(BINDING_RANGE_STORAGE_BUFFER);
    LogError<true,char[34],char_const*,char[40],int,char[3]>
              (false,"InitResourceLayout",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
               ,0xfc,(char (*) [34])"The number of bindings in range \'",(char **)&msg,
               (char (*) [40])"\' is greater than the maximum allowed (",
               &(pRVar9->m_DeviceLimits).MaxStorageBlock,(char (*) [3])0x2ed6c5);
  }
  if ((uint)(pRVar9->m_DeviceLimits).MaxImagesUnits < (uint)Bindings._M_elems[2]) {
    msg._M_dataplus._M_p = GetBindingRangeName(BINDING_RANGE_IMAGE);
    LogError<true,char[34],char_const*,char[40],int,char[3]>
              (false,"InitResourceLayout",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
               ,0xfe,(char (*) [34])"The number of bindings in range \'",(char **)&msg,
               (char (*) [40])"\' is greater than the maximum allowed (",
               &(pRVar9->m_DeviceLimits).MaxImagesUnits,(char (*) [3])0x2ed6c5);
  }
  return;
}

Assistant:

void PipelineStateGLImpl::InitResourceLayout(PSO_CREATE_INTERNAL_FLAGS InternalFlags,
                                             const TShaderStages&      ShaderStages,
                                             SHADER_TYPE               ActiveStages)
{
    if (m_UsingImplicitSignature)
    {
        if ((InternalFlags & PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0) != 0)
        {
            // Release deserialized default signature as it is empty in OpenGL.
            // We need to create a new one from scratch.
            m_Signatures[0].Release();
        }

        const auto SignDesc = GetDefaultSignatureDesc(ShaderStages, ActiveStages);
        // Always initialize default resource signature as internal device object.
        // This is necessary to avoid cyclic references from TexRegionRenderer.
        // This may never be a problem as the PSO keeps the reference to the device if necessary.
        constexpr bool bIsDeviceInternal = true;
        InitDefaultSignature(SignDesc, GetActiveShaderStages(), bIsDeviceInternal);
        VERIFY_EXPR(m_Signatures[0]);
    }

    DeviceContextGLImpl* pImmediateCtx = m_pDevice->GetImmediateContext(0);
    VERIFY_EXPR(pImmediateCtx != nullptr);
    auto& CtxState = pImmediateCtx->GetContextState();

    if (m_IsProgramPipelineSupported)
    {
        for (size_t i = 0; i < ShaderStages.size(); ++i)
        {
            const ShaderGLImpl*                      pShaderGL  = ShaderStages[i];
            std::shared_ptr<const ShaderResourcesGL> pResources = pShaderGL->GetShaderResources();
            m_GLPrograms[i]->SetResources(pResources);
            ValidateShaderResources(std::move(pResources), pShaderGL->GetDesc().Name, pShaderGL->GetDesc().ShaderType);
        }
    }
    else
    {
        VERIFY_EXPR(m_GLPrograms[0] != nullptr && m_GLPrograms[0]->GetLinkStatus() == GLProgram::LinkStatus::Succeeded);

        std::shared_ptr<const ShaderResourcesGL> pResources = m_GLPrograms[0]->GetResources();
        if (!pResources)
        {
            // If resources are not loaded yet for this program, load them now
            const auto SamplerResFlag = GetSamplerResourceFlag(ShaderStages, false /*SilenceWarning*/);

            pResources = m_GLPrograms[0]->LoadResources(
                ActiveStages,
                GetSamplerResourceFlag(ShaderStages, SamplerResFlag),
                CtxState);
        }
        ValidateShaderResources(std::move(pResources), m_Desc.Name, ActiveStages);
    }

    // Apply resource bindings to programs.
    PipelineResourceSignatureGLImpl::TBindings Bindings = {};
    for (Uint32 s = 0; s < m_SignatureCount; ++s)
    {
        const auto& pSignature = m_Signatures[s];
        if (pSignature == nullptr)
            continue;

        m_BaseBindings[s] = Bindings;
        for (Uint32 p = 0; p < m_NumPrograms; ++p)
        {
            // GL programs are keyed by shader IDs and resource signature IDs or resource layout.
            // Consequently, any pipeline that uses a cached program will assign the same bindings.
            m_GLPrograms[p]->ApplyBindings(pSignature, CtxState, Bindings);
        }

        pSignature->ShiftBindings(Bindings);
    }

    const auto& Limits = GetDevice()->GetDeviceLimits();

    if (Bindings[BINDING_RANGE_UNIFORM_BUFFER] > static_cast<Uint32>(Limits.MaxUniformBlocks))
        LOG_ERROR_AND_THROW("The number of bindings in range '", GetBindingRangeName(BINDING_RANGE_UNIFORM_BUFFER), "' is greater than the maximum allowed (", Limits.MaxUniformBlocks, ").");
    if (Bindings[BINDING_RANGE_TEXTURE] > static_cast<Uint32>(Limits.MaxTextureUnits))
        LOG_ERROR_AND_THROW("The number of bindings in range '", GetBindingRangeName(BINDING_RANGE_TEXTURE), "' is greater than the maximum allowed (", Limits.MaxTextureUnits, ").");
    if (Bindings[BINDING_RANGE_STORAGE_BUFFER] > static_cast<Uint32>(Limits.MaxStorageBlock))
        LOG_ERROR_AND_THROW("The number of bindings in range '", GetBindingRangeName(BINDING_RANGE_STORAGE_BUFFER), "' is greater than the maximum allowed (", Limits.MaxStorageBlock, ").");
    if (Bindings[BINDING_RANGE_IMAGE] > static_cast<Uint32>(Limits.MaxImagesUnits))
        LOG_ERROR_AND_THROW("The number of bindings in range '", GetBindingRangeName(BINDING_RANGE_IMAGE), "' is greater than the maximum allowed (", Limits.MaxImagesUnits, ").");
}